

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O1

bool __thiscall
DListBase<unsigned_long,_RealCount>::Append<Memory::HeapAllocator>
          (DListBase<unsigned_long,_RealCount> *this,HeapAllocator *allocator,unsigned_long *data)

{
  DListNodeBase<unsigned_long> *pDVar1;
  HeapAllocator *alloc;
  anon_union_8_3_7fb8a913_for_next *paVar2;
  undefined1 local_40 [8];
  TrackAllocData data_1;
  
  local_40 = (undefined1  [8])&DListNode<unsigned_long>::typeinfo;
  data_1.typeinfo = (type_info *)0x0;
  data_1.plusSize = 0xffffffffffffffff;
  data_1.count = (size_t)anon_var_dwarf_278d72;
  data_1.filename._0_4_ = 0xf0;
  alloc = Memory::HeapAllocator::TrackAllocInfo(allocator,(TrackAllocData *)local_40);
  paVar2 = (anon_union_8_3_7fb8a913_for_next *)new<Memory::HeapAllocator>(0x18,alloc,0x300d4a);
  paVar2[2] = (anon_union_8_3_7fb8a913_for_next)*data;
  pDVar1 = (this->super_DListNodeBase<unsigned_long>).prev.base;
  paVar2[1].base = pDVar1;
  *paVar2 = pDVar1->next;
  *(anon_union_8_3_7fb8a913_for_next **)((long)pDVar1->next + 8) = paVar2;
  (pDVar1->next).base = (DListNodeBase<unsigned_long> *)paVar2;
  (this->super_RealCount).count = (this->super_RealCount).count + 1;
  return true;
}

Assistant:

bool Append(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            DListBase::InsertNodeAfter(this->Prev(), newNode);
            this->IncrementCount();
            return true;
        }
        return false;
    }